

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::readPair(Kvm *this,istream *in)

{
  bool bVar1;
  Value *pVVar2;
  KatException *pKVar3;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  char c;
  allocator<char> local_61;
  Value *cdr_obj;
  Value *car_obj;
  GcGuard readGuard;
  string local_40;
  
  anon_unknown.dwarf_e6eb::eatWhitespace(in);
  std::operator>>(in,&c);
  if (c == ')') {
    return this->NIL;
  }
  std::istream::putback((char)in);
  car_obj = (Value *)0x0;
  cdr_obj = (Value *)0x0;
  readGuard.gc_ = &this->gc_;
  readGuard.times_ = 0;
  GcGuard::pushLocalStackRoot(&readGuard,&car_obj);
  GcGuard::pushLocalStackRoot(&readGuard,&cdr_obj);
  car_obj = (Value *)read(this,(int)in,__buf,in_RCX);
  if (car_obj != (Value *)0x0) {
    anon_unknown.dwarf_e6eb::eatWhitespace(in);
    std::operator>>(in,&c);
    if (c != '.') {
      std::istream::putback((char)in);
      cdr_obj = readPair(this,in);
      pVVar2 = makeCell(this,car_obj,cdr_obj);
      goto LAB_0010ca91;
    }
    c = std::istream::peek();
    bVar1 = anon_unknown.dwarf_e6eb::isDelimiter(c);
    if (!bVar1) {
      pKVar3 = (KatException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"dot not followed by delimiter",&local_61);
      anon_unknown.dwarf_e6eb::KatException::KatException(pKVar3,&local_40);
      __cxa_throw(pKVar3,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    cdr_obj = (Value *)read(this,(int)in,__buf_00,in_RCX);
    if (cdr_obj != (Value *)0x0) {
      anon_unknown.dwarf_e6eb::eatWhitespace(in);
      std::operator>>(in,&c);
      if (c != ')') {
        pKVar3 = (KatException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"where was the trailing paren?",&local_61);
        anon_unknown.dwarf_e6eb::KatException::KatException(pKVar3,&local_40);
        __cxa_throw(pKVar3,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      pVVar2 = makeCell(this,car_obj,cdr_obj);
      goto LAB_0010ca91;
    }
  }
  pVVar2 = (Value *)0x0;
LAB_0010ca91:
  GcGuard::~GcGuard(&readGuard);
  return pVVar2;
}

Assistant:

const Value* Kvm::readPair(std::istream &in)
{
    eatWhitespace(in);

    char c;
    in >> c;
    if (c == ')') return NIL;
    in.putback(c);

    const Value *car_obj = nullptr;
    const Value *cdr_obj = nullptr;
    GcGuard readGuard{gc_};
    readGuard.pushLocalStackRoot(&car_obj);
    readGuard.pushLocalStackRoot(&cdr_obj);

    car_obj = read(in);
    if (!car_obj) return nullptr;
    eatWhitespace(in);
    in >> c;
    if (c == '.')  /* improper list */
    {
        c = in.peek(); // FIXME: peek returns int
        if (!isDelimiter(c))
        {
            throw KatException("dot not followed by delimiter");
        }
        cdr_obj = read(in);
        if (!cdr_obj) return nullptr;
        eatWhitespace(in);
        in >> c;
        if (c != ')')
        {
            throw KatException("where was the trailing paren?");
        }
        auto result = makeCell(car_obj, cdr_obj);
        return result;
    } else /* read list */
    {
        in.putback(c);
        cdr_obj = readPair(in);
        auto result = makeCell(car_obj, cdr_obj);
        return result;
    }
}